

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_left_delim_join.cpp
# Opt level: O0

void __thiscall
duckdb::LeftDelimJoinLocalState::LeftDelimJoinLocalState
          (LeftDelimJoinLocalState *this,ClientContext *context,PhysicalLeftDelimJoin *delim_join)

{
  const_reference this_00;
  PhysicalOperator *this_01;
  ClientContext *in_RDX;
  ColumnDataCollection *in_RSI;
  undefined8 *in_RDI;
  vector<duckdb::LogicalType,_true> *in_stack_ffffffffffffff88;
  vector<duckdb::LogicalType,_true> *in_stack_ffffffffffffff90;
  ColumnDataAppendState *state;
  ColumnDataAllocatorType in_stack_ffffffffffffffdf;
  vector<duckdb::LogicalType,_true> *in_stack_ffffffffffffffe0;
  ColumnDataCollection *this_02;
  
  LocalSinkState::LocalSinkState((LocalSinkState *)0x1835dd2);
  *in_RDI = &PTR__LeftDelimJoinLocalState_0352d888;
  unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true>::unique_ptr
            ((unique_ptr<duckdb::LocalSinkState,_std::default_delete<duckdb::LocalSinkState>,_true>
              *)0x1835df3);
  state = (ColumnDataAppendState *)(in_RDI + 7);
  this_02 = in_RSI;
  this_00 = vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true>::operator[]
                      ((vector<std::reference_wrapper<duckdb::PhysicalOperator>,_true> *)
                       in_stack_ffffffffffffff90,(size_type)in_stack_ffffffffffffff88);
  this_01 = ::std::reference_wrapper<duckdb::PhysicalOperator>::get(this_00);
  PhysicalOperator::GetTypes(this_01);
  vector<duckdb::LogicalType,_true>::vector(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  ColumnDataCollection::ColumnDataCollection
            (this_02,in_RDX,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdf);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x1835e67);
  ColumnDataAppendState::ColumnDataAppendState((ColumnDataAppendState *)(in_RDI + 0x15));
  ColumnDataCollection::InitializeAppend(in_RSI,state);
  return;
}

Assistant:

explicit LeftDelimJoinLocalState(ClientContext &context, const PhysicalLeftDelimJoin &delim_join)
	    : lhs_data(context, delim_join.children[0].get().GetTypes()) {
		lhs_data.InitializeAppend(append_state);
	}